

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_source_info_cb(pa_context *context,pa_source_info *info,int eol,void *user_data)

{
  undefined8 *puVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  pulse_dev_list_data *list_data;
  long lVar7;
  long lVar8;
  
  if (eol != 0) {
    (*cubeb_pa_threaded_mainloop_signal)
              (*(pa_threaded_mainloop **)(*(long *)((long)user_data + 0x20) + 0x10),0);
    return;
  }
  pcVar6 = cubeb_strings_intern
                     (*(cubeb_strings **)(*(long *)((long)user_data + 0x20) + 0x58),info->name);
  if (pcVar6 != (char *)0x0) {
    pulse_ensure_dev_list_data_list_size((pulse_dev_list_data *)user_data);
    lVar2 = *(long *)((long)user_data + 0x10);
    lVar7 = (ulong)*(uint *)((long)user_data + 0x1c) * 0x58;
    lVar8 = lVar2 + lVar7;
    puVar1 = (undefined8 *)(lVar2 + 0x40 + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar2 + 0x30 + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar2 + 0x20 + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar2 + 0x10 + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)(lVar2 + 0x50 + lVar7) = 0;
    *(char **)(lVar2 + 8 + lVar7) = pcVar6;
    *(char **)(lVar2 + lVar7) = pcVar6;
    pcVar6 = strdup(info->description);
    *(char **)(lVar2 + 0x10 + lVar7) = pcVar6;
    pcVar6 = (*cubeb_pa_proplist_gets)(info->proplist,"sysfs.path");
    if (pcVar6 != (char *)0x0) {
      pcVar6 = strdup(pcVar6);
      *(char **)(lVar8 + 0x18) = pcVar6;
    }
    pcVar6 = (*cubeb_pa_proplist_gets)(info->proplist,"device.vendor.name");
    if (pcVar6 != (char *)0x0) {
      pcVar6 = strdup(pcVar6);
      *(char **)(lVar8 + 0x20) = pcVar6;
    }
    *(undefined4 *)(lVar8 + 0x28) = 1;
    uVar3 = 2;
    if ((info->active_port != (pa_source_port_info *)0x0) &&
       ((has_pulse_v2 == 0 || (uVar3 = 1, info->active_port->available != 1)))) {
      uVar3 = 2;
    }
    *(undefined4 *)(lVar8 + 0x2c) = uVar3;
    iVar4 = strcmp(info->name,*(char **)((long)user_data + 8));
    uVar3 = 0xf;
    if (iVar4 != 0) {
      uVar3 = 0;
    }
    *(undefined4 *)(lVar8 + 0x30) = uVar3;
    *(undefined4 *)(lVar8 + 0x34) = 0x3030;
    uVar5 = (info->sample_spec).format + ~PA_SAMPLE_ULAW;
    uVar3 = 0x1000;
    if (uVar5 < 4) {
      uVar3 = *(undefined4 *)(&DAT_00147230 + (ulong)uVar5 * 4);
    }
    *(undefined4 *)(lVar8 + 0x38) = uVar3;
    *(uint *)(lVar8 + 0x3c) = (uint)(info->channel_map).channels;
    *(uint32_t *)(lVar8 + 0x40) = (info->sample_spec).rate;
    *(undefined8 *)(lVar8 + 0x44) = 0x10005dc00;
    *(undefined8 *)(lVar8 + 0x4c) = 0;
    *(int *)((long)user_data + 0x1c) = *(int *)((long)user_data + 0x1c) + 1;
  }
  return;
}

Assistant:

static void
pulse_source_info_cb(pa_context * context, const pa_source_info * info,
    int eol, void * user_data)
{
  pulse_dev_list_data * list_data = user_data;
  cubeb_device_info * devinfo;
  char const * prop = NULL;
  char const * device_id = NULL;

  (void)context;

  if (eol) {
    WRAP(pa_threaded_mainloop_signal)(list_data->context->mainloop, 0);
    return;
  }

  device_id = info->name;
  if (intern_device_id(list_data->context, &device_id) != CUBEB_OK) {
    assert(NULL);
    return;
  }

  pulse_ensure_dev_list_data_list_size(list_data);
  devinfo = &list_data->devinfo[list_data->count];
  memset(devinfo, 0, sizeof(cubeb_device_info));

  devinfo->device_id = device_id;
  devinfo->devid = (cubeb_devid) devinfo->device_id;
  devinfo->friendly_name = strdup(info->description);
  prop = WRAP(pa_proplist_gets)(info->proplist, "sysfs.path");
  if (prop)
    devinfo->group_id = strdup(prop);
  prop = WRAP(pa_proplist_gets)(info->proplist, "device.vendor.name");
  if (prop)
    devinfo->vendor_name = strdup(prop);

  devinfo->type = CUBEB_DEVICE_TYPE_INPUT;
  devinfo->state = pulse_get_state_from_source_port(info->active_port);
  devinfo->preferred = (strcmp(info->name, list_data->default_source_name) == 0) ?
    CUBEB_DEVICE_PREF_ALL : CUBEB_DEVICE_PREF_NONE;

  devinfo->format = CUBEB_DEVICE_FMT_ALL;
  devinfo->default_format = pulse_format_to_cubeb_format(info->sample_spec.format);
  devinfo->max_channels = info->channel_map.channels;
  devinfo->min_rate = 1;
  devinfo->max_rate = PA_RATE_MAX;
  devinfo->default_rate = info->sample_spec.rate;

  devinfo->latency_lo = 0;
  devinfo->latency_hi = 0;

  list_data->count += 1;
}